

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

UnknownFieldSet * __thiscall
google::protobuf::internal::
InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
::mutable_unknown_fields_slow
          (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           *this)

{
  Container *pCVar1;
  Container *container;
  Arena *my_arena;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *this_local;
  Arena *local_58;
  Container *local_30;
  Container *t;
  
  if (((uint)this->ptr_ & 1) == 1) {
    pCVar1 = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             ::
             PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                       ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                         *)this);
    local_58 = pCVar1->arena;
  }
  else {
    local_58 = PtrValue<google::protobuf::Arena>(this);
  }
  if (local_58 == (Arena *)0x0) {
    local_30 = (Container *)operator_new(0x10);
    (local_30->unknown_fields).fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         0x0;
    local_30->arena = (Arena *)0x0;
    Container::Container(local_30);
  }
  else {
    local_30 = (Container *)
               Arena::AllocateAligned
                         (local_58,(type_info *)
                                   &InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                                    ::Container::typeinfo,0x10);
    memset(local_30,0,0x10);
    Container::Container(local_30);
    Arena::AddListNode(local_58,local_30,
                       arena_destruct_object<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                      );
  }
  this->ptr_ = (void *)((ulong)local_30 | 1);
  local_30->arena = local_58;
  return &local_30->unknown_fields;
}

Assistant:

GOOGLE_ATTRIBUTE_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container* container = Arena::Create<Container>(my_arena);
    ptr_ = reinterpret_cast<void*>(
        reinterpret_cast<intptr_t>(container) | kTagContainer);
    container->arena = my_arena;
    return &(container->unknown_fields);
  }